

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_operations.cpp
# Opt level: O3

void Am_Move_Object(Am_Object *object,Am_Object *ref_object,bool above)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  long *plVar4;
  Am_Ptr pvVar5;
  ostream *poVar6;
  Am_Slot_Key key;
  int value;
  Am_Value_List components;
  Am_Object current;
  Am_Object owner;
  Am_Value_List local_70;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Slot local_30;
  
  bVar1 = Am_Object::Valid(object);
  if (bVar1) {
    bVar1 = Am_Object::Valid(ref_object);
    if (bVar1) {
      bVar1 = Am_Object::operator==(object,ref_object);
      if (bVar1) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"** Am_Move_Object called same object, ");
        poVar6 = operator<<(poVar6,object);
        poVar6 = std::operator<<(poVar6,", as both moved object and reference object.");
        std::endl<char,std::char_traits<char>>(poVar6);
        Am_Error();
      }
      Am_Object::Get_Object(&local_58,(Am_Slot_Key)object,10);
      bVar1 = Am_Object::Valid(&local_58);
      if (bVar1) {
        key = (Am_Slot_Key)ref_object;
        Am_Object::Get_Object((Am_Object *)&local_70,key,10);
        bVar1 = Am_Object::operator!=((Am_Object *)&local_70,&local_58);
        Am_Object::~Am_Object((Am_Object *)&local_70);
        if (bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"** Am_Move_Object:  the object ",0x1f);
          poVar6 = operator<<((ostream *)&std::cerr,object);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," has owner ",0xb);
          poVar6 = operator<<(poVar6,&local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"and the ref_object ",0x13);
          poVar6 = operator<<(poVar6,ref_object);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," has owner ",0xb);
          Am_Object::Get_Object((Am_Object *)&local_70,key,10);
          poVar6 = operator<<(poVar6,(Am_Object *)&local_70);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," they must be the same.",0x17);
          std::endl<char,std::char_traits<char>>(poVar6);
          Am_Object::~Am_Object((Am_Object *)&local_70);
        }
        else {
          Am_Object::Am_Object(&local_38,&Am_Graphical_Object);
          bVar1 = Am_Object::Is_Instance_Of(object,&local_38);
          Am_Object::~Am_Object(&local_38);
          if (bVar1) {
            Am_Object::Am_Object(&local_40,&Am_Graphical_Object);
            bVar1 = Am_Object::Is_Instance_Of(ref_object,&local_40);
            Am_Object::~Am_Object(&local_40);
            if (bVar1) {
              Am_Object::Make_Unique(&local_58,0x82);
              Am_Value_List::Am_Value_List(&local_70);
              pAVar2 = Am_Object::Get(&local_58,0x82,0);
              Am_Value_List::operator=(&local_70,pAVar2);
              Am_Value_List::Start(&local_70);
              pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(object);
              Am_Value_List::Member(&local_70,pAVar3);
              Am_Value_List::Delete(&local_70,false);
              Am_Value_List::Start(&local_70);
              pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(ref_object);
              Am_Value_List::Member(&local_70,pAVar3);
              pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(object);
              Am_Value_List::Insert(&local_70,pAVar3,(uint)above,false);
              local_60.data = (Am_Object_Data *)0x0;
              Am_Value_List::Start(&local_70);
              value = 0;
              while( true ) {
                bVar1 = Am_Value_List::Last(&local_70);
                if (bVar1) break;
                pAVar2 = Am_Value_List::Get(&local_70);
                Am_Object::operator=(&local_60,pAVar2);
                Am_Object::Set(&local_60,0x85,value,0);
                value = value + 1;
                Am_Value_List::Next(&local_70);
              }
              Am_Object::Note_Changed(&local_58,0x82);
              local_30 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)object,0x69);
              Am_Demon_Queue::Enqueue(&Main_Demon_Queue,graphics_repaint,0,&local_30);
              Am_Object::~Am_Object(&local_60);
              Am_Value_List::~Am_Value_List(&local_70);
              goto LAB_001d8abb;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"** Am_Move_Object called with an object ",0x28);
            poVar6 = operator<<((ostream *)&std::cerr,object);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," that is a graphical object and a ref_object ",0x2d);
            poVar6 = operator<<(poVar6,ref_object);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," that is not.",0xd);
          }
          else {
            Am_Object::Am_Object(&local_48,&Am_Window);
            bVar1 = Am_Object::Is_Instance_Of(object,&local_48);
            Am_Object::~Am_Object(&local_48);
            if (bVar1) {
              Am_Object::Am_Object(&local_50,&Am_Window);
              bVar1 = Am_Object::Is_Instance_Of(ref_object,&local_50);
              Am_Object::~Am_Object(&local_50);
              if (bVar1) {
                Am_Object::Get_Object((Am_Object *)&local_70,(Am_Slot_Key)object,10);
                Am_Object::Get_Object(&local_60,key,10);
                bVar1 = Am_Object::operator!=((Am_Object *)&local_70,&local_60);
                Am_Object::~Am_Object(&local_60);
                Am_Object::~Am_Object((Am_Object *)&local_70);
                if (bVar1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"** Am_Move_Object called with two windows",0x29)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr," with different parents: ",0x19);
                  poVar6 = operator<<((ostream *)&std::cerr,object);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
                  operator<<(poVar6,ref_object);
                }
                pAVar2 = Am_Object::Get(object,0x7d2,0);
                plVar4 = (long *)Am_Value::operator_cast_to_void_(pAVar2);
                pAVar2 = Am_Object::Get(ref_object,0x7d2,0);
                pvVar5 = Am_Value::operator_cast_to_void_(pAVar2);
                if (pvVar5 != (Am_Ptr)0x0 && plVar4 != (long *)0x0) {
                  (**(code **)(*plVar4 + 0x28 + (ulong)!above * 8))(plVar4,pvVar5);
                }
                goto LAB_001d8abb;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"** Am_Move_Object called with an object ",0x28);
              poVar6 = operator<<((ostream *)&std::cerr,object);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6," that is a window and a ref_object ",0x23);
              poVar6 = operator<<(poVar6,ref_object);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6," that is not.",0xd);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"** Am_Move_Object: Attempt to move ",0x23);
              poVar6 = operator<<((ostream *)&std::cerr,object);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6," which is not a graphical object or window",0x2a);
            }
          }
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        Am_Error();
      }
LAB_001d8abb:
      Am_Object::~Am_Object(&local_58);
      return;
    }
  }
  Am_Error("** Am_Move_Object called with (0L) object or ref_object\n");
}

Assistant:

void
Am_Move_Object(Am_Object object, Am_Object ref_object, bool above)
{
  if (!object.Valid() || !ref_object.Valid())
    Am_Error("** Am_Move_Object called with (0L) object or ref_object\n");
  if (object == ref_object) {
    std::cerr << "** Am_Move_Object called same object, " << object
              << ", as both "
                 "moved object and reference object."
              << std::endl;
    Am_Error();
  }
  Am_Object owner = object.Get_Owner();
  if (!owner.Valid())
    return;
  if (ref_object.Get_Owner() != owner) {
    std::cerr << "** Am_Move_Object:  the object " << object << " has owner "
              << owner << "and the ref_object " << ref_object << " has owner "
              << ref_object.Get_Owner() << " they must be the same."
              << std::endl;
    Am_Error();
  }
  if (object.Is_Instance_Of(Am_Graphical_Object)) {
    if (!ref_object.Is_Instance_Of(Am_Graphical_Object)) {
      std::cerr << "** Am_Move_Object called with an object " << object
                << " that is a graphical object and a ref_object " << ref_object
                << " that is not." << std::endl;
      Am_Error();
    }
    owner.Make_Unique(Am_GRAPHICAL_PARTS);
    Am_Value_List components;
    components = owner.Get(Am_GRAPHICAL_PARTS);
    components.Start();
    components.Member(object);
    components.Delete(false);
    components.Start();
    components.Member(ref_object);
    components.Insert(object, above ? Am_AFTER : Am_BEFORE, false);
    int rank = 0;
    Am_Object current;
    for (components.Start(); !components.Last(); components.Next()) {
      current = components.Get();
      current.Set(Am_RANK, rank);
      ++rank;
    }
    owner.Note_Changed(Am_GRAPHICAL_PARTS);
    Main_Demon_Queue.Enqueue(
        graphics_repaint, 0,
        ((Am_Object_Advanced &)object).Get_Slot(Am_VISIBLE));
  } else if (object.Is_Instance_Of(Am_Window)) {
    if (!ref_object.Is_Instance_Of(Am_Window)) {
      std::cerr << "** Am_Move_Object called with an object " << object
                << " that is a window and a ref_object " << ref_object
                << " that is not." << std::endl;
      Am_Error();
    };
    // objects must have same parent
    if (object.Get_Owner() != ref_object.Get_Owner()) {
      std::cerr << "** Am_Move_Object called with two windows"
                << " with different parents: " << object << ", " << ref_object;
    }
    Am_Drawonable *draw1 = Am_Drawonable::Narrow(object.Get(Am_DRAWONABLE));
    Am_Drawonable *draw2 = Am_Drawonable::Narrow(ref_object.Get(Am_DRAWONABLE));
    if (draw1 && draw2) {
      if (above) {
        draw1->Raise_Window(draw2);
      } else {
        draw1->Lower_Window(draw2);
      }
    }
  } else {
    std::cerr << "** Am_Move_Object: Attempt to move " << object
              << " which is not a graphical object or window" << std::endl;
    Am_Error();
  }
}